

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O3

void RuntimeManifestFile::CreateIfValid
               (string *filename,
               vector<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>,_std::allocator<std::unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>_>_>
               *manifest_files)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  CharReaderBuilder builder;
  Value root_node;
  string errors;
  ostringstream error_ss;
  ifstream json_stream;
  undefined1 local_478 [48];
  ValueHolder local_448;
  undefined8 uStack_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f8;
  string local_3d8;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_3b8;
  string local_3a0 [3];
  ios_base local_330 [264];
  IStream local_228 [520];
  
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  local_3a0[0]._M_dataplus._M_p = (pointer)&local_3a0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
                 "RuntimeManifestFile::CreateIfValid - attempting to load ",filename);
  local_448.int_ = 0;
  uStack_440 = 0;
  local_438[0]._M_allocated_capacity = 0;
  LoaderLogger::LogInfoMessage
            (local_3a0,(string *)local_478,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_448);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_448);
  pcVar1 = local_478 + 0x10;
  if ((pointer)local_478._0_8_ != pcVar1) {
    operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0[0]._M_dataplus._M_p != &local_3a0[0].field_2) {
    operator_delete(local_3a0[0]._M_dataplus._M_p,local_3a0[0].field_2._M_allocated_capacity + 1);
  }
  local_478._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_478,"RuntimeManifestFile::CreateIfValid ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0,(string *)local_478,_S_out);
  if ((pointer)local_478._0_8_ != pcVar1) {
    operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"failed to open ",0xf);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3a0,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".  Does it exist?",0x11);
    local_478._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"");
    std::__cxx11::stringbuf::str();
    local_418._M_allocated_capacity = 0;
    local_418._8_8_ = 0;
    local_408._M_allocated_capacity = 0;
    LoaderLogger::LogErrorMessage
              ((string *)local_478,(string *)&local_448,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_418);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&local_418);
    if (local_448 != local_438) {
      operator_delete(local_448.string_,local_438[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_478._0_8_ != pcVar1) {
      operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
    }
    goto LAB_00115d2c;
  }
  Json::CharReaderBuilder::CharReaderBuilder((CharReaderBuilder *)local_478);
  local_418._8_8_ = 0;
  local_408._M_allocated_capacity = local_408._M_allocated_capacity & 0xffffffffffffff00;
  local_418._M_allocated_capacity = (size_type)&local_408;
  Json::Value::Value((Value *)&local_448,nullValue);
  bVar3 = Json::parseFromStream
                    ((Factory *)local_478,local_228,(Value *)&local_448,(String *)&local_418);
  if (bVar3) {
    bVar3 = Json::Value::isObject((Value *)&local_448);
    if (!bVar3) goto LAB_00115baf;
    CreateIfValid((Value *)&local_448,filename,manifest_files);
  }
  else {
LAB_00115baf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3a0,"failed to parse ",0x10)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3a0,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    if (local_418._8_8_ != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3a0," (Error message: ",0x11);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3a0,(char *)local_418._M_allocated_capacity,
                          local_418._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3a0," Is it a valid runtime manifest file?",0x25);
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
    std::__cxx11::stringbuf::str();
    local_3b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b8.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(&local_3f8,&local_3d8,&local_3b8);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::~Value((Value *)&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_allocated_capacity != &local_408) {
    operator_delete((void *)local_418._M_allocated_capacity,local_408._M_allocated_capacity + 1);
  }
  Json::CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)local_478);
LAB_00115d2c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
  std::ios_base::~ios_base(local_330);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void RuntimeManifestFile::CreateIfValid(std::string const &filename,
                                        std::vector<std::unique_ptr<RuntimeManifestFile>> &manifest_files) {
    std::ifstream json_stream(filename, std::ifstream::in);

    LoaderLogger::LogInfoMessage("", "RuntimeManifestFile::CreateIfValid - attempting to load " + filename);
    std::ostringstream error_ss("RuntimeManifestFile::CreateIfValid ");
    if (!json_stream.is_open()) {
        error_ss << "failed to open " << filename << ".  Does it exist?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }
    Json::CharReaderBuilder builder;
    std::string errors;
    Json::Value root_node = Json::nullValue;
    if (!Json::parseFromStream(builder, json_stream, &root_node, &errors) || !root_node.isObject()) {
        error_ss << "failed to parse " << filename << ".";
        if (!errors.empty()) {
            error_ss << " (Error message: " << errors << ")";
        }
        error_ss << " Is it a valid runtime manifest file?";
        LoaderLogger::LogErrorMessage("", error_ss.str());
        return;
    }

    CreateIfValid(root_node, filename, manifest_files);
}